

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

float deqp::gles2::Performance::vectorFloatStandardDeviation<long>
                (vector<long,_std::allocator<long>_> *v)

{
  size_type sVar1;
  const_reference pvVar2;
  float fVar3;
  float local_28;
  int local_1c;
  float d;
  int i;
  float result;
  float average;
  vector<long,_std::allocator<long>_> *v_local;
  
  fVar3 = vectorFloatAverage<long>(v);
  d = 0.0;
  for (local_1c = 0; sVar1 = std::vector<long,_std::allocator<long>_>::size(v),
      local_1c < (int)sVar1; local_1c = local_1c + 1) {
    pvVar2 = std::vector<long,_std::allocator<long>_>::operator[](v,(long)local_1c);
    d = ((float)*pvVar2 - fVar3) * ((float)*pvVar2 - fVar3) + d;
  }
  sVar1 = std::vector<long,_std::allocator<long>_>::size(v);
  local_28 = (float)sVar1;
  fVar3 = ::deFloatSqrt(d / local_28);
  return fVar3;
}

Assistant:

static float vectorFloatStandardDeviation (const vector<T>& v)
{
	float average	= vectorFloatAverage(v);
	float result	= 0.0f;
	for (int i = 0; i < (int)v.size(); i++)
	{
		float d = (float)v[i] - average;
		result += d*d;
	}
	return deFloatSqrt(result/(float)v.size());
}